

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscCompiler.cpp
# Opt level: O0

void __thiscall
NscCompiler::NscCompiler
          (NscCompiler *this,ResourceManager *ResMan,bool EnableExtensions,bool SaveSymbolTable)

{
  _func_int **pp_Var1;
  byte in_CL;
  byte in_DL;
  _func_int **in_RSI;
  CNwnLoader *in_RDI;
  NscCompilerState *unaff_retaddr;
  
  CNwnLoader::CNwnLoader(in_RDI);
  in_RDI->_vptr_CNwnLoader = (_func_int **)&PTR_LoadResource_00298cd0;
  in_RDI[1]._vptr_CNwnLoader = in_RSI;
  *(undefined1 *)&in_RDI[2]._vptr_CNwnLoader = 0;
  *(byte *)((long)&in_RDI[2]._vptr_CNwnLoader + 1) = in_DL & 1;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CNwnLoader + 2) = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CNwnLoader + 3) = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CNwnLoader + 4) = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CNwnLoader + 5) = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CNwnLoader + 6) = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CNwnLoader + 7) = 0;
  *(undefined1 *)&in_RDI[3]._vptr_CNwnLoader = 0;
  pp_Var1 = (_func_int **)operator_new(0x958);
  NscCompilerState::NscCompilerState(unaff_retaddr);
  in_RDI[4]._vptr_CNwnLoader = pp_Var1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1d7521);
  in_RDI[8]._vptr_CNwnLoader = (_func_int **)0x0;
  in_RDI[9]._vptr_CNwnLoader = (_func_int **)0x0;
  in_RDI[10]._vptr_CNwnLoader = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0xb]._vptr_CNwnLoader = 1;
  std::
  map<NscCompiler::ResourceCacheKey,_NscCompiler::ResourceCacheEntry,_std::less<NscCompiler::ResourceCacheKey>,_std::allocator<std::pair<const_NscCompiler::ResourceCacheKey,_NscCompiler::ResourceCacheEntry>_>_>
  ::map((map<NscCompiler::ResourceCacheKey,_NscCompiler::ResourceCacheEntry,_std::less<NscCompiler::ResourceCacheKey>,_std::allocator<std::pair<const_NscCompiler::ResourceCacheKey,_NscCompiler::ResourceCacheEntry>_>_>
         *)0x1d754b);
  in_RDI[0x12]._vptr_CNwnLoader = (_func_int **)0x0;
  *(byte *)((long)in_RDI[4]._vptr_CNwnLoader + 0x951) = in_CL & 1;
  return;
}

Assistant:

NscCompiler::NscCompiler (
	 ResourceManager & ResMan,
	 bool EnableExtensions,
	 bool SaveSymbolTable
	)
: m_ResourceManager (ResMan),
  m_EnableExtensions (EnableExtensions),
  m_ShowIncludes (false),
  m_ShowPreprocessed(false),
  m_GenerateMakeDeps(false),
  m_StrictModeEnabled(false),
  m_SuppressWarnings(false),
  m_Initialized (false),
  m_NWScriptParsed (false),
  m_SymbolTableReady (false),
  m_CompilerState (new NscCompilerState ()),
  m_ResLoadContext (NULL),
  m_ResLoadFile (NULL),
  m_ResUnloadFile (NULL),
  m_CacheResources (true),
  m_ErrorOutput (NULL)
{
	m_CompilerState ->m_fSaveSymbolTable = SaveSymbolTable;
}